

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O2

bool __thiscall
cmBuildNameCommand::InitialPass
          (cmBuildNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  string buildname;
  string RegExp;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string compiler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0036,
                     "The build_name command should not be called; see CMP0036.");
  bVar3 = true;
  if (!bVar1) {
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish == name) {
      std::__cxx11::string::string
                ((string *)&compiler,"called with incorrect number of arguments",
                 (allocator *)&buildname);
      cmCommand::SetError(&this->super_cmCommand,&compiler);
      std::__cxx11::string::~string((string *)&compiler);
      bVar3 = false;
    }
    else {
      pcVar2 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::string((string *)&buildname,"WinNT",(allocator *)&compiler);
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&compiler,"UNIX",(allocator *)&RegExp);
        pcVar2 = cmMakefile::GetDefinition(this_00,&compiler);
        std::__cxx11::string::~string((string *)&compiler);
        if (pcVar2 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&buildname);
          cmSystemTools::RunSingleCommand
                    ("uname -a",&buildname,&buildname,(int *)0x0,(char *)0x0,OUTPUT_MERGE,0.0);
          if (buildname._M_string_length != 0) {
            std::__cxx11::string::string
                      ((string *)&RegExp,"([^ ]*) [^ ]* ([^ ]*) ",(allocator *)&compiler);
            cmsys::RegularExpression::RegularExpression
                      ((RegularExpression *)&compiler,RegExp._M_dataplus._M_p);
            bVar1 = cmsys::RegularExpression::find
                              ((RegularExpression *)&compiler,buildname._M_dataplus._M_p);
            if (bVar1) {
              cmsys::RegularExpression::match_abi_cxx11_
                        (&local_158,(RegularExpression *)&compiler,1);
              std::operator+(&local_138,&local_158,"-");
              cmsys::RegularExpression::match_abi_cxx11_
                        (&local_178,(RegularExpression *)&compiler,2);
              std::operator+(&local_48,&local_138,&local_178);
              std::__cxx11::string::operator=((string *)&buildname,(string *)&local_48);
              std::__cxx11::string::~string((string *)&local_48);
              std::__cxx11::string::~string((string *)&local_178);
              std::__cxx11::string::~string((string *)&local_138);
              std::__cxx11::string::~string((string *)&local_158);
            }
            cmsys::RegularExpression::~RegularExpression((RegularExpression *)&compiler);
            std::__cxx11::string::~string((string *)&RegExp);
          }
        }
        std::__cxx11::string::string
                  ((string *)&compiler,"${CMAKE_CXX_COMPILER}",(allocator *)&RegExp);
        cmMakefile::ExpandVariablesInString((this->super_cmCommand).Makefile,&compiler);
        std::__cxx11::string::append((char *)&buildname);
        cmsys::SystemTools::GetFilenameName(&RegExp,&compiler);
        std::__cxx11::string::append((string *)&buildname);
        std::__cxx11::string::~string((string *)&RegExp);
        cmsys::SystemTools::ReplaceString(&buildname,"/","_");
        cmsys::SystemTools::ReplaceString(&buildname,"(","_");
        cmsys::SystemTools::ReplaceString(&buildname,")","_");
        cmMakefile::AddCacheDefinition
                  ((this->super_cmCommand).Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,buildname._M_dataplus._M_p,
                   "Name of build.",STRING,false);
        std::__cxx11::string::~string((string *)&compiler);
        std::__cxx11::string::~string((string *)&buildname);
      }
      else {
        cmsys::RegularExpression::RegularExpression((RegularExpression *)&compiler,"[()/]");
        bVar1 = cmsys::RegularExpression::find((RegularExpression *)&compiler,pcVar2);
        if (bVar1) {
          std::__cxx11::string::string((string *)&buildname,pcVar2,(allocator *)&RegExp);
          cmsys::SystemTools::ReplaceString(&buildname,"/","_");
          cmsys::SystemTools::ReplaceString(&buildname,"(","_");
          cmsys::SystemTools::ReplaceString(&buildname,")","_");
          cmMakefile::AddCacheDefinition
                    ((this->super_cmCommand).Makefile,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,buildname._M_dataplus._M_p,
                     "Name of build.",STRING,false);
          std::__cxx11::string::~string((string *)&buildname);
        }
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)&compiler);
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmBuildNameCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0036,
      "The build_name command should not be called; see CMP0036."))
    { return true; }
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if(cacheValue)
    {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    if (reg.find(cacheValue))
      {
      std::string cv = cacheValue;
      cmSystemTools::ReplaceString(cv,"/", "_");
      cmSystemTools::ReplaceString(cv,"(", "_");
      cmSystemTools::ReplaceString(cv,")", "_");
      this->Makefile->AddCacheDefinition(args[0],
                                     cv.c_str(),
                                     "Name of build.",
                                     cmState::STRING);
      }
    return true;
    }


  std::string buildname = "WinNT";
  if(this->Makefile->GetDefinition("UNIX"))
    {
    buildname = "";
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if(!buildname.empty())
      {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg( RegExp.c_str() );
      if(reg.find(buildname.c_str()))
        {
        buildname = reg.match(1) + "-" + reg.match(2);
        }
      }
    }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  this->Makefile->ExpandVariablesInString ( compiler );
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  cmSystemTools::ReplaceString(buildname,
                               "/", "_");
  cmSystemTools::ReplaceString(buildname,
                               "(", "_");
  cmSystemTools::ReplaceString(buildname,
                               ")", "_");

  this->Makefile->AddCacheDefinition(args[0],
                                 buildname.c_str(),
                                 "Name of build.",
                                 cmState::STRING);
  return true;
}